

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

string * testing::internal::XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  byte *pbVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (str->_M_string_length != 0) {
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    do {
      bVar1 = *pbVar2;
      if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0)))) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (byte *)((str->_M_dataplus)._M_p + str->_M_string_length));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters(
    const std::string& str) {
  std::string output;
  output.reserve(str.size());
  for (std::string::const_iterator it = str.begin(); it != str.end(); ++it)
    if (IsValidXmlCharacter(*it))
      output.push_back(*it);

  return output;
}